

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O3

int ccall_classify_struct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  ushort uVar1;
  CType *pCVar2;
  uint uVar3;
  uint ofs_00;
  
  uVar3 = 4;
  if (ct->size < 0x11) {
    for (uVar1 = ct->sib; uVar1 != 0; uVar1 = pCVar2[uVar1].sib) {
      pCVar2 = cts->tab;
      ofs_00 = pCVar2[uVar1].size + ofs;
      uVar3 = pCVar2[uVar1].info;
      if (uVar3 >> 0x1c == 10) {
        *(byte *)(rcl + (7 < ofs_00)) = *(byte *)(rcl + (7 < ofs_00)) | 1;
      }
      else if (uVar3 >> 0x1c == 9) {
        ccall_classify_ct(cts,(CType *)((long)&pCVar2->info + (ulong)((uVar3 & 0xffff) << 4)),rcl,
                          ofs_00);
      }
      else if ((uVar3 & 0xf0ff0000) == 0x80030000) {
        ccall_classify_struct
                  (cts,(CType *)((long)&pCVar2->info + (ulong)((uVar3 & 0xffff) << 4)),rcl,ofs_00);
      }
    }
    uVar3 = (rcl[1] | *rcl) & 4;
  }
  return uVar3;
}

Assistant:

static int ccall_classify_struct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ct->size > 16) return CCALL_RCL_MEM;  /* Too big, gets memory class. */
  while (ct->sib) {
    CTSize fofs;
    ct = ctype_get(cts, ct->sib);
    fofs = ofs+ct->size;
    if (ctype_isfield(ct->info))
      ccall_classify_ct(cts, ctype_rawchild(cts, ct), rcl, fofs);
    else if (ctype_isbitfield(ct->info))
      rcl[(fofs >= 8)] |= CCALL_RCL_INT;  /* NYI: unaligned bitfields? */
    else if (ctype_isxattrib(ct->info, CTA_SUBTYPE))
      ccall_classify_struct(cts, ctype_rawchild(cts, ct), rcl, fofs);
  }
  return ((rcl[0]|rcl[1]) & CCALL_RCL_MEM);  /* Memory class? */
}